

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> * __thiscall
cfd::core::ConfidentialTransaction::UnblindTxOut
          (vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
           *__return_storage_ptr__,ConfidentialTransaction *this,
          vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *blinding_keys)

{
  pointer pCVar1;
  bool bVar2;
  pointer pCVar3;
  CfdException *this_00;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  unsigned_long local_d0;
  unsigned_long local_c8;
  undefined1 local_c0 [40];
  undefined **local_98;
  pointer local_90;
  undefined **local_78;
  pointer local_70;
  undefined **local_58;
  pointer local_50;
  
  pCVar3 = (this->vout_).
           super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->vout_).
           super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_c8 = ((long)pCVar1 - (long)pCVar3 >> 3) * -0x1084210842108421;
  local_d0 = (long)(blinding_keys->
                   super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(blinding_keys->
                   super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 5;
  if (local_c8 - local_d0 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pCVar1 != pCVar3) {
      uVar5 = 1;
      uVar6 = 0;
      do {
        AbstractTxOut::GetLockingScript((Script *)local_c0,&pCVar3[uVar6].super_AbstractTxOut);
        bVar2 = Script::IsEmpty((Script *)local_c0);
        Script::~Script((Script *)local_c0);
        if (!bVar2) {
          bVar2 = Privkey::IsValid((blinding_keys->
                                   super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>
                                   )._M_impl.super__Vector_impl_data._M_start + uVar6);
          if (bVar2) {
            UnblindTxOut((UnblindParameter *)local_c0,this,uVar5 - 1,
                         (blinding_keys->
                         super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar6);
            ::std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
            ::emplace_back<cfd::core::UnblindParameter>
                      (__return_storage_ptr__,(UnblindParameter *)local_c0);
            local_58 = &PTR__ConfidentialValue_00723840;
            if (local_50 != (pointer)0x0) {
              operator_delete(local_50);
            }
            local_78 = &PTR__BlindFactor_00723500;
            if (local_70 != (pointer)0x0) {
              operator_delete(local_70);
            }
            local_98 = &PTR__BlindFactor_00723500;
            if (local_90 != (pointer)0x0) {
              operator_delete(local_90);
            }
            local_c0._0_8_ = &PTR__ConfidentialAssetId_00723760;
            if ((void *)CONCAT44(local_c0._12_4_,local_c0._8_4_) != (void *)0x0) {
              operator_delete((void *)CONCAT44(local_c0._12_4_,local_c0._8_4_));
            }
          }
        }
        uVar6 = (ulong)uVar5;
        pCVar3 = (this->vout_).
                 super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar4 = ((long)(this->vout_).
                       super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 3) *
                -0x1084210842108421;
        uVar5 = uVar5 + 1;
      } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
    }
    return __return_storage_ptr__;
  }
  local_c0._0_8_ = "cfdcore_elements_transaction.cpp";
  local_c0._8_4_ = 0xb69;
  local_c0._16_8_ = (long)"CfdUnblindTxOut" + 3;
  logger::log<unsigned_long&,unsigned_long&>
            ((CfdSourceLocation *)local_c0,kCfdLogLevelWarning,
             "Unmatch size blinding_keys and txouts.: txout num=[{}], blinding key num=[{}]",
             &local_c8,&local_d0);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_c0._0_8_ = local_c0 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,"Unmatch size blinding_keys and txouts.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_c0);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<UnblindParameter> ConfidentialTransaction::UnblindTxOut(
    const std::vector<Privkey> &blinding_keys) {
  // validate input vector size
  if (vout_.size() != blinding_keys.size()) {
    warn(
        CFD_LOG_SOURCE,
        "Unmatch size blinding_keys and txouts.:"
        " txout num=[{}], blinding key num=[{}]",
        vout_.size(), blinding_keys.size());
    throw CfdException(
        kCfdIllegalArgumentError, "Unmatch size blinding_keys and txouts.");
  }

  std::vector<UnblindParameter> results;
  for (uint32_t index = 0; index < vout_.size(); index++) {
    // skip if vout is txout for fee
    if (vout_[index].GetLockingScript().IsEmpty()) {
      // fall-through
    } else if (!blinding_keys[index].IsValid()) {
      // fall-through
    } else {
      results.push_back(UnblindTxOut(index, blinding_keys[index]));
    }
  }

  return results;
}